

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O2

void __thiscall Assimp::Q3BSPFileParser::getVertices(Q3BSPFileParser *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  sQ3BSPVertex *psVar8;
  Q3BSPModel *pQVar9;
  size_t idx;
  ulong uVar10;
  long lVar11;
  
  pQVar9 = this->m_pModel;
  lVar11 = (long)(pQVar9->m_Lumps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[10]->iOffset;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)(pQVar9->m_Vertices).
                             super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pQVar9->m_Vertices).
                             super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1) {
    psVar8 = (sQ3BSPVertex *)operator_new(0x2c);
    pcVar1 = (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = *(undefined8 *)(pcVar1 + lVar11);
    uVar3 = *(undefined8 *)(pcVar1 + lVar11 + 8);
    uVar4 = *(undefined8 *)(pcVar1 + lVar11 + 0x10);
    uVar5 = *(undefined8 *)(pcVar1 + lVar11 + 0x10 + 8);
    uVar6 = *(undefined8 *)(pcVar1 + lVar11 + 0x1c);
    uVar7 = *(undefined8 *)(pcVar1 + lVar11 + 0x1c + 8);
    (psVar8->vPosition).x = (float)(int)uVar2;
    (psVar8->vPosition).y = (float)(int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&(psVar8->vPosition).z = uVar3;
    *(undefined8 *)&(psVar8->vTexCoord).y = uVar4;
    *(undefined8 *)&(psVar8->vLightmap).y = uVar5;
    (psVar8->vNormal).x = (float)(int)uVar6;
    (psVar8->vNormal).y = (float)(int)((ulong)uVar6 >> 0x20);
    *(undefined8 *)&(psVar8->vNormal).z = uVar7;
    lVar11 = lVar11 + 0x2c;
    (pQVar9->m_Vertices).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar10] = psVar8;
    pQVar9 = this->m_pModel;
  }
  return;
}

Assistant:

void Q3BSPFileParser::getVertices()
{
    size_t Offset = m_pModel->m_Lumps[ kVertices ]->iOffset;
    for ( size_t idx = 0; idx < m_pModel->m_Vertices.size(); idx++ )
    {
        sQ3BSPVertex *pVertex = new sQ3BSPVertex;
        memcpy( pVertex, &m_Data[ Offset ], sizeof( sQ3BSPVertex ) );
        Offset += sizeof( sQ3BSPVertex );
        m_pModel->m_Vertices[ idx ] = pVertex;
    }
}